

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

RPCHelpMan * getrpcinfo(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff6b8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff6c0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  allocator<char> *in_stack_fffffffffffff6f8;
  iterator in_stack_fffffffffffff700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff71f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff720;
  string *in_stack_fffffffffffff728;
  RPCResult *in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff738;
  Type in_stack_fffffffffffff73c;
  RPCResult *in_stack_fffffffffffff740;
  undefined1 *local_8b0;
  undefined1 *local_898;
  undefined1 *local_880;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  allocator<char> local_6fd;
  allocator<char> local_6fc;
  allocator<char> local_6fb;
  allocator<char> local_6fa [2];
  pointer local_6f8;
  pointer pRStack_6f0;
  pointer local_6e8;
  RPCMethodImpl *in_stack_fffffffffffff920;
  allocator<char> local_6ba;
  undefined1 local_6b9 [9];
  size_type sStack_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  undefined1 local_692;
  undefined1 local_691 [31];
  undefined1 local_672;
  undefined1 local_671 [32];
  allocator<char> local_651 [31];
  allocator<char> local_632;
  allocator<char> local_631 [25];
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  allocator<char> local_5fa;
  allocator<char> local_5f9 [449];
  undefined1 local_438 [272];
  undefined1 local_328 [64];
  undefined1 local_2e8 [136];
  undefined1 local_260 [64];
  undefined1 local_220 [272];
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_618 = 0;
  uStack_610 = 0;
  local_608 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  this_00 = (RPCHelpMan *)local_671;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  name = (string *)&local_672;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  description = (string *)local_691;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_692;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_6b9._1_8_ = (pointer)0x0;
  sStack_6b0 = 0;
  local_6a8._0_8_ = 0;
  results = (RPCResults *)(local_6b9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,(string *)in_stack_fffffffffffff730
             ,in_stack_fffffffffffff728,in_stack_fffffffffffff720,(bool)in_stack_fffffffffffff71f);
  examples = (RPCExamples *)local_6b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,(string *)in_stack_fffffffffffff730
             ,in_stack_fffffffffffff728,in_stack_fffffffffffff720,(bool)in_stack_fffffffffffff71f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff6b8);
  __l._M_len = (size_type)in_stack_fffffffffffff708;
  __l._M_array = in_stack_fffffffffffff700;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,(string *)in_stack_fffffffffffff730
             ,in_stack_fffffffffffff728,in_stack_fffffffffffff720,(bool)in_stack_fffffffffffff71f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff6b8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff708;
  __l_00._M_array = in_stack_fffffffffffff700;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l_00,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,(string *)in_stack_fffffffffffff730
             ,in_stack_fffffffffffff728,in_stack_fffffffffffff720,(bool)in_stack_fffffffffffff71f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_6f8 = (pointer)0x0;
  pRStack_6f0 = (pointer)0x0;
  local_6e8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,(string *)in_stack_fffffffffffff730
             ,in_stack_fffffffffffff728,in_stack_fffffffffffff720,(bool)in_stack_fffffffffffff71f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff6b8);
  __l_01._M_len = (size_type)in_stack_fffffffffffff708;
  __l_01._M_array = in_stack_fffffffffffff700;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l_01,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,(string *)in_stack_fffffffffffff730
             ,in_stack_fffffffffffff728,in_stack_fffffffffffff720,(bool)in_stack_fffffffffffff71f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
             in_stack_fffffffffffff730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleRpc(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff6b8,(string *)0x71492c);
  this = (RPCResult *)&stack0xfffffffffffff8e0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<getrpcinfo()::__0,void>
            (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,in_stack_fffffffffffff920);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6fd);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6fc);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6fb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_6fa);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_880 = local_110;
  do {
    local_880 = local_880 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_880 != local_220);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff924);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff925);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_898 = local_260;
  do {
    local_898 = local_898 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_898 != local_2e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_8b0 = local_328;
  do {
    local_8b0 = local_8b0 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_8b0 != local_438);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_6ba);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_6b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_692);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_691);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_672);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_671);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_671 + 0x1f));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_651);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_632);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_631);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_5fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_5f9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrpcinfo()
{
    return RPCHelpMan{"getrpcinfo",
                "\nReturns details of the RPC server.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::ARR, "active_commands", "All active commands",
                        {
                            {RPCResult::Type::OBJ, "", "Information about an active command",
                            {
                                 {RPCResult::Type::STR, "method", "The name of the RPC command"},
                                 {RPCResult::Type::NUM, "duration", "The running time in microseconds"},
                            }},
                        }},
                        {RPCResult::Type::STR, "logpath", "The complete file path to the debug log"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getrpcinfo", "")
                + HelpExampleRpc("getrpcinfo", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    LOCK(g_rpc_server_info.mutex);
    UniValue active_commands(UniValue::VARR);
    for (const RPCCommandExecutionInfo& info : g_rpc_server_info.active_commands) {
        UniValue entry(UniValue::VOBJ);
        entry.pushKV("method", info.method);
        entry.pushKV("duration", int64_t{Ticks<std::chrono::microseconds>(SteadyClock::now() - info.start)});
        active_commands.push_back(std::move(entry));
    }

    UniValue result(UniValue::VOBJ);
    result.pushKV("active_commands", std::move(active_commands));

    const std::string path = LogInstance().m_file_path.utf8string();
    UniValue log_path(UniValue::VSTR, path);
    result.pushKV("logpath", std::move(log_path));

    return result;
}
    };
}